

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O3

fy_atom * fy_fill_atom_mark(fy_input *fyi,fy_mark *start_mark,fy_mark *end_mark,fy_atom *handle)

{
  int iVar1;
  int iVar2;
  undefined1 auVar3 [16];
  
  auVar3._0_4_ = -(uint)(fyi == (fy_input *)0x0);
  auVar3._4_4_ = -(uint)(start_mark == (fy_mark *)0x0);
  auVar3._8_4_ = -(uint)(end_mark == (fy_mark *)0x0);
  auVar3._12_4_ = -(uint)(handle == (fy_atom *)0x0);
  iVar2 = movmskps((int)handle,auVar3);
  if (iVar2 != 0) {
    return (fy_atom *)0x0;
  }
  handle->storage_hint = 0;
  handle->fyi = (fy_input *)0x0;
  (handle->end_mark).input_pos = 0;
  (handle->end_mark).line = 0;
  (handle->end_mark).column = 0;
  (handle->start_mark).input_pos = 0;
  (handle->start_mark).line = 0;
  (handle->start_mark).column = 0;
  *(undefined8 *)&handle->increment = 0;
  iVar2 = start_mark->line;
  iVar1 = start_mark->column;
  (handle->start_mark).input_pos = start_mark->input_pos;
  (handle->start_mark).line = iVar2;
  (handle->start_mark).column = iVar1;
  iVar2 = end_mark->line;
  iVar1 = end_mark->column;
  (handle->end_mark).input_pos = end_mark->input_pos;
  (handle->end_mark).line = iVar2;
  (handle->end_mark).column = iVar1;
  handle->fyi = fyi;
  handle->storage_hint = 0;
  *(undefined4 *)&handle->field_0x34 = 0x40;
  return handle;
}

Assistant:

struct fy_atom *fy_fill_atom_mark(struct fy_input *fyi,
                                  const struct fy_mark *start_mark,
                                  const struct fy_mark *end_mark,
                                  struct fy_atom *handle) {
    if (!fyi || !start_mark || !end_mark || !handle)
        return NULL;

    memset(handle, 0, sizeof(*handle));

    handle->start_mark = *start_mark;
    handle->end_mark = *end_mark;
    handle->fyi = fyi;

    /* default is plain, modify at return */
    handle->style = FYAS_PLAIN;
    handle->chomp = FYAC_CLIP;
    /* by default we don't do storage hints, it's the job of the caller */
    handle->storage_hint = 0;
    handle->storage_hint_valid = false;

    return handle;
}